

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  CppStringType CVar7;
  int32_t iVar8;
  uint32_t uVar9;
  int iVar10;
  MapFieldBase *this;
  Descriptor *pDVar11;
  size_t sVar12;
  size_t sVar13;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar14;
  uint64_t uVar15;
  int64_t iVar16;
  Message *pMVar17;
  undefined4 extraout_var_00;
  string *psVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExtensionSet *this_00;
  string *psVar19;
  undefined8 extraout_RAX;
  Reflection *this_01;
  ulong uVar20;
  size_t sVar21;
  Metadata MVar22;
  MapIterator iter;
  MapIterator end;
  anon_union_16_2_39e9c77e_for_Rep_0 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  KeyValue local_d8;
  int local_b8;
  MapValueConstRef local_b0;
  Reflection *local_a0;
  LogMessageFatal local_98 [16];
  MapIterator local_88;
  
  MVar22 = Message::GetMetadata(message);
  this_01 = MVar22.reflection;
  if ((field->type_ == '\v') && (bVar5 = FieldDescriptor::is_map_message_type(field), bVar5)) {
    this = Reflection::GetMapData(this_01,message,field);
    bVar5 = MapFieldBase::IsMapValid(this);
    if (!bVar5) goto LAB_00329fef;
    MapIterator::MapIterator((MapIterator *)&local_f8.as_tree,message,field);
    MapIterator::MapIterator(&local_88,message,field);
    pDVar11 = FieldDescriptor::message_type(field);
    uVar20 = (ulong)pDVar11->field_count_;
    if (0 < (long)uVar20) {
      field_00 = pDVar11->fields_;
      pDVar11 = FieldDescriptor::message_type(field);
      if (1 < (long)pDVar11->field_count_) {
        pFVar2 = pDVar11->fields_;
        MapFieldBase::MapBegin(this,(MapIterator *)&local_f8.as_tree);
        MapFieldBase::MapEnd(this,&local_88);
        sVar21 = 0;
        while (bVar5 = MapFieldBase::EqualIterator
                                 ((MapFieldBase *)local_e8._8_8_,(MapIterator *)&local_f8.as_tree,
                                  &local_88), !bVar5) {
          sVar12 = MapKeyDataOnlyByteSize(field_00,(MapKey *)&local_d8.string_value);
          sVar13 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(ulong)pFVar2[1].type_,&local_b0);
          uVar6 = (int)sVar13 + (int)sVar12 + 2U | 1;
          iVar10 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar21 = sVar21 + sVar12 + sVar13 + 2 + (ulong)(iVar10 * 9 + 0x49U >> 6);
          MapFieldBase::IncreaseIterator
                    ((MapFieldBase *)local_e8._8_8_,(MapIterator *)&local_f8.as_tree);
        }
        if ((local_88.key_.type_ == CPPTYPE_STRING) &&
           (local_88.key_.val_._0_8_ != (undefined1 *)((long)&local_88.key_.val_ + 0x10))) {
          operator_delete((void *)local_88.key_.val_.int64_value,local_88.key_.val_._16_8_ + 1);
        }
        if (local_b8 == 9) {
          if (local_d8._0_8_ != (undefined1 *)((long)&local_d8.string_value.union_ + 0x10)) {
            operator_delete((void *)local_d8.int64_value,local_d8._16_8_ + 1);
            return sVar21;
          }
          return sVar21;
        }
        return sVar21;
      }
      psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (1,(long)pDVar11->field_count_,"index < field_count()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0x9f4,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
      goto LAB_0032a761;
    }
LAB_0032a706:
    psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        (0,uVar20,"index < field_count()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
               ,0x9f4,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_0032a761:
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_98);
  }
LAB_00329fef:
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    uVar20 = (ulong)(0xbf < bVar1);
    FieldDataOnlyByteSize();
    goto LAB_0032a706;
  }
  if ((bVar1 & 0x20) == 0) {
    sVar21 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar5 = Reflection::HasField(this_01,message,field);
      sVar21 = (size_t)bVar5;
    }
  }
  else {
    uVar6 = Reflection::FieldSize(this_01,message,field);
    sVar21 = (size_t)uVar6;
  }
  switch(field->type_) {
  case '\x01':
  case '\x06':
  case '\x10':
    sVar21 = sVar21 << 3;
    break;
  case '\x02':
  case '\a':
  case '\x0f':
    sVar21 = sVar21 << 2;
    break;
  case '\x03':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar20 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((uVar20 | 1) != 0) {
            for (; (uVar20 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      uVar20 = Reflection::GetInt64(this_01,message,field);
LAB_0032a644:
      uVar20 = uVar20 | 1;
LAB_0032a648:
      lVar4 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      iVar10 = (int)lVar4;
LAB_0032a64c:
      return (ulong)(iVar10 * 9 + 0x49U >> 6);
    }
    goto LAB_0032a7ca;
  case '\x04':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar15 = Reflection::GetRepeatedUInt64(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((uVar15 | 1) != 0) {
            for (; (uVar15 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      uVar20 = Reflection::GetUInt64(this_01,message,field);
      goto LAB_0032a644;
    }
    goto LAB_0032a7dd;
  case '\x05':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar6 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((long)(int)(uVar6 | 1) != 0) {
            for (; (ulong)(long)(int)(uVar6 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      uVar6 = Reflection::GetInt32(this_01,message,field);
      uVar20 = (ulong)(int)(uVar6 | 1);
      goto LAB_0032a648;
    }
    goto LAB_0032a7a4;
  case '\b':
    break;
  case '\t':
  case '\f':
    CVar7 = FieldDescriptor::cpp_string_type(field);
    if (CVar7 != kCord) {
      if (sVar21 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      local_a0 = this_01;
      do {
        local_f8.as_tree.cordz_info = (cordz_info_t)&local_e8;
        local_f8.as_tree.rep = (CordRep *)0x0;
        local_e8._M_local_buf[0] = '\0';
        bVar1 = field->field_0x1;
        bVar5 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar5) {
          psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_88);
        }
        if ((bVar1 & 0x20) == 0) {
          psVar18 = Reflection::GetStringReference
                              (local_a0,message,field,(string *)&local_f8.as_tree);
        }
        else {
          psVar18 = Reflection::GetRepeatedStringReference
                              (local_a0,message,field,(int)sVar13,(string *)&local_f8.as_tree);
        }
        sVar3 = psVar18->_M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.as_tree.cordz_info != &local_e8) {
          operator_delete((void *)local_f8.as_tree.cordz_info,
                          CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) +
                          1);
        }
        uVar6 = (uint)sVar3 | 1;
        iVar10 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        sVar12 = sVar12 + sVar3 + (ulong)(iVar10 * 9 + 0x49U >> 6);
        sVar13 = sVar13 + 1;
      } while (sVar21 != sVar13);
      return sVar12;
    }
    if (sVar21 == 0) {
      return 0;
    }
    sVar12 = 0;
    do {
      Reflection::GetCord((Reflection *)&local_f8.as_tree,(Message *)this_01,
                          (FieldDescriptor *)message);
      if (((long)local_f8.data[0] & 1U) == 0) {
        uVar20 = (ulong)(long)local_f8.data[0] >> 1;
      }
      else {
        uVar20 = (local_f8.as_tree.rep)->length;
      }
      uVar6 = (uint)uVar20 | 1;
      iVar10 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      sVar12 = sVar12 + uVar20 + (ulong)(iVar10 * 9 + 0x49U >> 6);
      absl::lts_20240722::Cord::~Cord((Cord *)&local_f8.as_tree);
      sVar21 = sVar21 - 1;
    } while (sVar21 != 0);
    return sVar12;
  case '\n':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) == 0) {
        pMVar17 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
        iVar10 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
        return CONCAT44(extraout_var_01,iVar10);
      }
      if (sVar21 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      do {
        pMVar17 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar13);
        iVar10 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
        sVar12 = sVar12 + CONCAT44(extraout_var,iVar10);
        sVar13 = sVar13 + 1;
      } while (sVar21 != sVar13);
      return sVar12;
    }
    goto LAB_0032a791;
  case '\v':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) == 0) {
        if ((bVar1 & 8) == 0) {
          pMVar17 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
          iVar10 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
          sVar21 = CONCAT44(extraout_var_02,iVar10);
        }
        else {
          this_00 = Reflection::GetExtensionSet(this_01,message);
          sVar21 = ExtensionSet::GetMessageByteSizeLong(this_00,field->number_);
        }
        uVar6 = (uint)sVar21 | 1;
        iVar10 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        return (iVar10 * 9 + 0x49U >> 6) + sVar21;
      }
      if (sVar21 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      do {
        pMVar17 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar13);
        uVar6 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
        iVar10 = 0x1f;
        if ((uVar6 | 1) != 0) {
          for (; (uVar6 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        sVar12 = sVar12 + CONCAT44(extraout_var_00,uVar6) + (ulong)(iVar10 * 9 + 0x49U >> 6);
        sVar13 = sVar13 + 1;
      } while (sVar21 != sVar13);
      return sVar12;
    }
    goto LAB_0032a803;
  case '\r':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar9 = Reflection::GetRepeatedUInt32(this_01,message,field,(int)sVar13);
          iVar10 = 0x1f;
          if ((uVar9 | 1) != 0) {
            for (; (uVar9 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar12 = sVar12 + (iVar10 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      uVar9 = Reflection::GetUInt32(this_01,message,field);
      iVar10 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      goto LAB_0032a64c;
    }
    goto LAB_0032a77e;
  case '\x0e':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          pEVar14 = Reflection::GetRepeatedEnum(this_01,message,field,(int)sVar13);
          uVar20 = (long)pEVar14->number_ | 1;
          lVar4 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      pEVar14 = Reflection::GetEnum(this_01,message,field);
      uVar20 = (ulong)pEVar14->number_;
      goto LAB_0032a644;
    }
    goto LAB_0032a7b7;
  case '\x11':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          iVar8 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar13);
          uVar6 = iVar8 >> 0x1f ^ iVar8 * 2 | 1;
          iVar10 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar12 = sVar12 + (iVar10 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      iVar8 = Reflection::GetInt32(this_01,message,field);
      uVar6 = iVar8 >> 0x1f ^ iVar8 * 2 | 1;
      iVar10 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      goto LAB_0032a64c;
    }
    FieldDataOnlyByteSize();
LAB_0032a77e:
    FieldDataOnlyByteSize();
LAB_0032a791:
    FieldDataOnlyByteSize();
LAB_0032a7a4:
    FieldDataOnlyByteSize();
LAB_0032a7b7:
    FieldDataOnlyByteSize();
LAB_0032a7ca:
    FieldDataOnlyByteSize();
LAB_0032a7dd:
    FieldDataOnlyByteSize();
LAB_0032a7f0:
    FieldDataOnlyByteSize();
LAB_0032a803:
    FieldDataOnlyByteSize();
    if ((local_b8 == 9) &&
       (local_d8._0_8_ != (undefined1 *)((long)&local_d8.string_value.union_ + 0x10))) {
      operator_delete((void *)local_d8.int64_value,local_d8._16_8_ + 1);
    }
    _Unwind_Resume(extraout_RAX);
  case '\x12':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar21 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          iVar16 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar13);
          uVar20 = iVar16 >> 0x3f ^ iVar16 * 2 | 1;
          lVar4 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar21 != sVar13);
        return sVar12;
      }
      iVar16 = Reflection::GetInt64(this_01,message,field);
      uVar20 = iVar16 >> 0x3f ^ iVar16 * 2;
      goto LAB_0032a644;
    }
    goto LAB_0032a7f0;
  default:
    return 0;
  }
  return sVar21;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (size_t j = 0; j < count; j++) {                                  \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)

    case FieldDescriptor::TYPE_MESSAGE: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; ++j) {
          data_size += WireFormatLite::MessageSize(
              message_reflection->GetRepeatedMessage(message, field, j));
        }
        break;
      }
      if (field->is_extension()) {
        data_size += WireFormatLite::LengthDelimitedSize(
            message_reflection->GetExtensionSet(message).GetMessageByteSizeLong(
                field->number()));
        break;
      }
      data_size += WireFormatLite::MessageSize(
          message_reflection->GetMessage(message, field));
      break;
    }

#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        for (size_t j = 0; j < count; j++) {
          absl::Cord value = message_reflection->GetCord(message, field);
          data_size += WireFormatLite::StringSize(value);
        }
        break;
      }
      for (size_t j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}